

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

double __thiscall llvm::APFloat::remainder(APFloat *this,double __x,double __y)

{
  bool bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  APFloat *in_RSI;
  double __x_00;
  double __x_01;
  double dVar4;
  APFloat *RHS_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(in_RSI);
  if (pfVar2 != pfVar3) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3d3,"opStatus llvm::APFloat::remainder(const APFloat &)");
  }
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    dVar4 = detail::IEEEFloat::remainder(&(this->U).IEEE,__x_00,__y);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x3d8);
    }
    dVar4 = detail::DoubleAPFloat::remainder((DoubleAPFloat *)&(this->U).IEEE,__x_01,__y);
  }
  return dVar4;
}

Assistant:

opStatus remainder(const APFloat &RHS) {
    assert(&getSemantics() == &RHS.getSemantics() &&
           "Should only call on two APFloats with the same semantics");
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.remainder(RHS.U.IEEE);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.remainder(RHS.U.Double);
    llvm_unreachable("Unexpected semantics");
  }